

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  void *pvVar5;
  ulong uVar6;
  char *buf;
  size_t sVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  char *__s;
  char *pcVar13;
  curltime cVar14;
  char remain [4];
  byte local_5c [4];
  undefined1 local_58 [5];
  undefined3 uStack_53;
  undefined4 uStack_50;
  undefined1 uStack_4c;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  pvVar5 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  *done = false;
  if (pvVar5 == (void *)0x0) {
    return CURLE_FAILED_INIT;
  }
  cVar14 = Curl_now();
  *(time_t *)((long)pvVar5 + 0x58) = cVar14.tv_sec;
  *(int *)((long)pvVar5 + 0x60) = cVar14.tv_usec;
  *(byte *)((long)pvVar5 + 0x69) = *(byte *)((long)pvVar5 + 0x69) & 0xfe;
  local_5c[0] = 0;
  local_5c[1] = 0;
  local_5c[2] = 0;
  local_5c[3] = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_58 = (undefined1  [5])0x6c727563;
  uStack_53 = 0;
  pcVar13 = (data->state).aptr.user;
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "";
  }
  local_38 = strlen(pcVar13);
  __s = (data->state).aptr.passwd;
  if (__s == (char *)0x0) {
    __s = "";
  }
  local_40 = strlen(__s);
  uVar9 = 0;
  uVar6 = local_40 + local_38 + (ulong)(local_38 != 0) * 2 + (ulong)(local_40 != 0) * 2 + 0x18;
  uVar12 = uVar9;
  uVar10 = uVar6;
  if (uVar6 != 0) {
    do {
      local_58[uVar12 - 4] = (0x7f < uVar10) << 7 | (byte)uVar10 & 0x7f;
      uVar9 = uVar12 + 1;
      if (2 < uVar12) break;
      bVar3 = 0x7f < uVar10;
      uVar12 = uVar9;
      uVar10 = uVar10 >> 7;
    } while (bVar3);
  }
  uVar9 = uVar9 & 0xffffffff;
  uVar12 = uVar6 + uVar9 + 1;
  CVar4 = CURLE_WEIRD_SERVER_REPLY;
  if (0xfffffff < uVar12) goto LAB_001447b6;
  buf = (char *)(*Curl_ccalloc)(1,uVar12);
  if (buf == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
    goto LAB_001447b6;
  }
  *buf = '\x10';
  local_48 = uVar12;
  memcpy(buf + 1,local_5c,uVar9);
  pcVar1 = buf + uVar9 + 1;
  pcVar1[0] = '\0';
  pcVar1[1] = '\x04';
  pcVar1[2] = 'M';
  pcVar1[3] = 'Q';
  pcVar1[4] = 'T';
  pcVar1[5] = 'T';
  pcVar1[6] = '\x04';
  pcVar1[7] = '\x02';
  (buf + uVar9 + 9)[0] = '\0';
  (buf + uVar9 + 9)[1] = '<';
  CVar4 = Curl_rand_alnum(data,local_58 + 4,9);
  sVar7 = strlen(local_58);
  if (sVar7 == 0xc) {
    (buf + uVar9 + 0xb)[0] = '\0';
    (buf + uVar9 + 0xb)[1] = '\f';
    *(ulong *)(buf + uVar9 + 0xd) = CONCAT35(uStack_53,local_58);
    *(undefined4 *)(buf + uVar9 + 0x15) = uStack_50;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",local_58);
    }
    lVar11 = local_38 + uVar9 + 0x19;
    if (local_38 == 0) {
LAB_00144716:
      if (local_40 != 0) {
        if (0xffff < local_40) {
          pcVar13 = "Password too long: [%zu]";
          goto LAB_00144730;
        }
        buf[uVar9 + 8] = buf[uVar9 + 8] | 0x40;
        buf[lVar11] = (char)(local_40 >> 8);
        buf[lVar11 + 1] = (char)local_40;
        memcpy(buf + lVar11 + 2,__s,local_40);
      }
      if (CVar4 == CURLE_OK) {
        CVar4 = mqtt_send(data,buf,local_48);
      }
    }
    else {
      if (local_38 < 0x10000) {
        buf[uVar9 + 8] = buf[uVar9 + 8] | 0x80;
        lVar11 = local_38 + uVar9 + 0x1b;
        buf[uVar9 + 0x19] = (char)(local_38 >> 8);
        buf[uVar9 + 0x1a] = (char)local_38;
        memcpy(buf + uVar9 + 0x1b,pcVar13,local_38);
        goto LAB_00144716;
      }
      pcVar13 = "Username too long: [%zu]";
LAB_00144730:
      Curl_failf(data,pcVar13);
      CVar4 = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar7);
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  (*Curl_cfree)(buf);
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
  if (CVar4 == CURLE_OK) {
    puVar8 = (undefined8 *)Curl_conn_meta_get(data->conn,"meta:proto:mqtt:conn");
    if (puVar8 == (undefined8 *)0x0) {
      return CURLE_OK;
    }
    *puVar8 = 0x200000000;
    return CURLE_OK;
  }
LAB_001447b6:
  Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)CVar4);
  return CVar4;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  if(!mq)
    return CURLE_FAILED_INIT;
  mq->lastTime = Curl_now();
  mq->pingsent = FALSE;

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}